

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigWnd.c
# Opt level: O2

Vec_Ptr_t * Saig_ManWindowCollectPos(Aig_Man_t *p,Vec_Ptr_t *vNodes,Vec_Ptr_t **pvPointers)

{
  Vec_Ptr_t *p_00;
  Vec_Ptr_t *pVVar1;
  Aig_Obj_t *pObj;
  Aig_Obj_t *Entry;
  int i;
  
  p_00 = Vec_PtrAlloc(1000);
  if (pvPointers != (Vec_Ptr_t **)0x0) {
    pVVar1 = Vec_PtrAlloc(1000);
    *pvPointers = pVVar1;
  }
  for (i = 0; i < vNodes->nSize; i = i + 1) {
    pObj = (Aig_Obj_t *)Vec_PtrEntry(vNodes,i);
    Entry = Saig_ObjHasUnlabeledFanout(p,pObj);
    if (Entry != (Aig_Obj_t *)0x0) {
      Vec_PtrPush(p_00,pObj);
      if (pvPointers != (Vec_Ptr_t **)0x0) {
        Vec_PtrPush(*pvPointers,Entry);
      }
    }
  }
  return p_00;
}

Assistant:

Vec_Ptr_t * Saig_ManWindowCollectPos( Aig_Man_t * p, Vec_Ptr_t * vNodes, Vec_Ptr_t ** pvPointers )
{
    Vec_Ptr_t * vNodesPo;
    Aig_Obj_t * pObj, * pPointer;
    int i;
    vNodesPo = Vec_PtrAlloc( 1000 );
    if ( pvPointers )
        *pvPointers = Vec_PtrAlloc( 1000 );
    Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, i )
    {
        if ( (pPointer = Saig_ObjHasUnlabeledFanout(p, pObj)) )
        {
            Vec_PtrPush( vNodesPo, pObj );
            if ( pvPointers )
                Vec_PtrPush( *pvPointers, pPointer );
        }
    }
    return vNodesPo;
}